

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.cpp
# Opt level: O2

maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> * __thiscall
anon_unknown.dwarf_11da8::Base64Decode::convert
          (maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *__return_storage_ptr__,Base64Decode *this,string *source)

{
  pstore *this_00;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> it;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> in_R8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
  oit;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
  local_18;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (pstore *)(this->super_Test)._vptr_Test;
  pstore::
  from_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_18,this_00,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this_00 +
               (long)(this->super_Test).gtest_flag_saver_._M_t.
                     super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                     .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl
               ),(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&local_38,in_R8);
  if (local_18.valid_ == true) {
    pstore::maybe<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>::
    maybe<std::vector<unsigned_char,std::allocator<unsigned_char>>&,void>
              ((maybe<std::vector<unsigned_char,std::allocator<unsigned_char>>,void> *)
               __return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto Base64Decode::convert (std::string const & source) const -> pstore::maybe<container> {
        std::vector<std::uint8_t> out;
        std::back_insert_iterator<container> it = std::back_inserter (out);
        pstore::maybe<decltype (it)> const oit =
            pstore::from_base64 (std::begin (source), std::end (source), it);
        if (oit) {
            return pstore::just (out);
        }
        return pstore::nothing<container> ();
    }